

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error cdataSectionProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Error XVar1;
  char *local_20;
  
  local_20 = start;
  XVar1 = doCdataSection(parser,parser->m_encoding,&local_20,end,endPtr,
                         (parser->m_parsingStatus).finalBuffer == '\0');
  if (XVar1 == XML_ERROR_NONE) {
    if (local_20 != (char *)0x0) {
      if (parser->m_parentParser != (XML_Parser)0x0) {
        parser->m_processor = externalEntityContentProcessor;
        XVar1 = externalEntityContentProcessor(parser,local_20,end,endPtr);
        return XVar1;
      }
      parser->m_processor = contentProcessor;
      XVar1 = contentProcessor(parser,local_20,end,endPtr);
      return XVar1;
    }
    XVar1 = XML_ERROR_NONE;
  }
  return XVar1;
}

Assistant:

static enum XML_Error PTRCALL
cdataSectionProcessor(XML_Parser parser,
                      const char *start,
                      const char *end,
                      const char **endPtr)
{
  enum XML_Error result = doCdataSection(parser, encoding, &start, end,
                                         endPtr, (XML_Bool)!ps_finalBuffer);
  if (result != XML_ERROR_NONE)
    return result;
  if (start) {
    if (parentParser) {  /* we are parsing an external entity */
      processor = externalEntityContentProcessor;
      return externalEntityContentProcessor(parser, start, end, endPtr);
    }
    else {
      processor = contentProcessor;
      return contentProcessor(parser, start, end, endPtr);
    }
  }
  return result;
}